

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::xor_mhl(CPU *this)

{
  byte bVar1;
  ushort uVar2;
  Registers *pRVar3;
  int iVar4;
  
  uVar2._0_1_ = this->regs->h;
  uVar2._1_1_ = this->regs->l;
  iVar4 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)(ushort)(uVar2 << 8 | uVar2 >> 8));
  pRVar3 = this->regs;
  pRVar3->f = '\0';
  bVar1 = pRVar3->a;
  pRVar3->a = bVar1 ^ (byte)iVar4;
  if (bVar1 == (byte)iVar4) {
    pRVar3->f = 0x80;
  }
  return 2;
}

Assistant:

int CPU::xor_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    xor_r8(mmu.read_byte(addr));
    return 2;
}